

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong idx;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  idx_t i;
  ulong idx_00;
  idx_t idx_01;
  ulong uVar8;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t right;
  string_t right_00;
  string_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar6 = 8;
    for (idx_01 = 0; count != idx_01; idx_01 = idx_01 + 1) {
      left_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar6);
      left_01.value._0_8_ = *(undefined8 *)((long)ldata + lVar6 + -8);
      right_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + lVar6);
      right_01.value._0_8_ = *(undefined8 *)((long)rdata + lVar6 + -8);
      bVar2 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::NotEquals,duckdb::string_t,duckdb::string_t,bool>
                        (fun,left_01,right_01,mask,idx_01);
      result_data[idx_01] = bVar2;
      lVar6 = lVar6 + 0x10;
    }
  }
  else {
    idx_00 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = idx_00 + 0x40;
        if (count <= idx_00 + 0x40) {
          uVar8 = count;
        }
LAB_01755bda:
        uVar4 = idx_00 << 4 | 8;
        for (; idx = idx_00, idx_00 < uVar8; idx_00 = idx_00 + 1) {
          left.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar4);
          left.value._0_8_ = *(undefined8 *)((long)ldata + (uVar4 - 8));
          right.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar4);
          right.value._0_8_ = *(undefined8 *)((long)rdata + (uVar4 - 8));
          bVar2 = BinarySingleArgumentOperatorWrapper::
                  Operation<bool,duckdb::NotEquals,duckdb::string_t,duckdb::string_t,bool>
                            (fun,left,right,mask,idx_00);
          result_data[idx_00] = bVar2;
          uVar4 = uVar4 + 0x10;
        }
      }
      else {
        uVar4 = puVar1[uVar3];
        uVar8 = idx_00 + 0x40;
        if (count <= idx_00 + 0x40) {
          uVar8 = count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_01755bda;
        idx = uVar8;
        if (uVar4 != 0) {
          uVar5 = idx_00 << 4 | 8;
          for (uVar7 = 0; idx = idx_00 + uVar7, idx < uVar8; uVar7 = uVar7 + 1) {
            if ((uVar4 >> (uVar7 & 0x3f) & 1) != 0) {
              left_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar5);
              left_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar5 - 8));
              right_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar5);
              right_00.value._0_8_ = *(undefined8 *)((long)rdata + (uVar5 - 8));
              bVar2 = BinarySingleArgumentOperatorWrapper::
                      Operation<bool,duckdb::NotEquals,duckdb::string_t,duckdb::string_t,bool>
                                (fun,left_00,right_00,mask,idx);
              result_data[uVar7 + idx_00] = bVar2;
            }
            uVar5 = uVar5 + 0x10;
          }
        }
      }
      idx_00 = idx;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}